

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  ImGuiTextBuffer *this;
  int iVar1;
  ImGuiSettingsHandler *pIVar2;
  char *pcVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  int handler_n;
  long lVar8;
  char local_29;
  
  pIVar4 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  this = &pIVar4->SettingsIniData;
  lVar7 = 0;
  ImVector<char>::resize(&this->Buf,0);
  local_29 = '\0';
  ImVector<char>::push_back(&this->Buf,&local_29);
  for (lVar8 = 0; lVar8 < (pIVar4->SettingsHandlers).Size; lVar8 = lVar8 + 1) {
    pIVar2 = (pIVar4->SettingsHandlers).Data;
    (**(code **)((long)&pIVar2->WriteAllFn + lVar7))(pIVar4,(long)&pIVar2->TypeName + lVar7,this);
    lVar7 = lVar7 + 0x48;
  }
  if (out_size != (size_t *)0x0) {
    iVar1 = (this->Buf).Size;
    iVar5 = iVar1 + -1;
    if (iVar1 == 0) {
      iVar5 = 0;
    }
    *out_size = (long)iVar5;
  }
  pcVar3 = (pIVar4->SettingsIniData).Buf.Data;
  pcVar6 = ImGuiTextBuffer::EmptyString;
  if (pcVar3 != (char *)0x0) {
    pcVar6 = pcVar3;
  }
  return pcVar6;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}